

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

mallinfo * dlmallinfo(void)

{
  mchunkptr pmVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  mallinfo *in_RDI;
  size_t sVar5;
  malloc_segment *pmVar6;
  uint uVar7;
  ulong uVar8;
  mchunkptr pmVar9;
  ulong uVar10;
  bool bVar11;
  
  in_RDI->fordblks = 0;
  in_RDI->keepcost = 0;
  in_RDI->fsmblks = 0;
  in_RDI->uordblks = 0;
  in_RDI->hblkhd = 0;
  in_RDI->usmblks = 0;
  in_RDI->smblks = 0;
  in_RDI->hblks = 0;
  in_RDI->arena = 0;
  in_RDI->ordblks = 0;
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (((byte)_gm_.mflags & 2) != 0) {
    LOCK();
    UNLOCK();
    bVar11 = _gm_.mutex != 0;
    _gm_.mutex = 1;
    if (bVar11) {
      spin_acquire_lock(&_gm_.mutex);
    }
  }
  sVar2 = _gm_.topsize;
  if (_gm_.top != (mchunkptr)0x0) {
    sVar3 = _gm_.topsize + 0x50;
    sVar4 = 1;
    sVar5 = sVar3;
    for (pmVar6 = &_gm_.seg; pmVar6 != (malloc_segment *)0x0; pmVar6 = pmVar6->next) {
      pmVar1 = (mchunkptr)pmVar6->base;
      uVar7 = (int)pmVar1 + 0x10;
      uVar8 = (ulong)(-uVar7 & 0xf);
      if ((uVar7 & 0xf) == 0) {
        uVar8 = 0;
      }
      for (pmVar9 = (mchunkptr)((long)&pmVar1->prev_foot + uVar8);
          (((pmVar1 <= pmVar9 && (pmVar9 != _gm_.top)) &&
           (pmVar9 < (mchunkptr)((long)&pmVar1->prev_foot + pmVar6->size))) &&
          (uVar8 = pmVar9->head, uVar8 != 0xb));
          pmVar9 = (mchunkptr)((long)&pmVar9->prev_foot + uVar10)) {
        uVar10 = uVar8 & 0xfffffffffffffff8;
        sVar5 = sVar5 + uVar10;
        uVar7 = (uint)uVar8 & 3;
        uVar8 = 0;
        if (uVar7 == 1) {
          uVar8 = uVar10;
        }
        sVar3 = sVar3 + uVar8;
        sVar4 = sVar4 + (uVar7 == 1);
      }
    }
    in_RDI->arena = sVar5;
    in_RDI->ordblks = sVar4;
    sVar4 = _gm_.footprint;
    in_RDI->hblkhd = _gm_.footprint - sVar5;
    in_RDI->usmblks = _gm_.max_footprint;
    in_RDI->uordblks = sVar4 - sVar3;
    in_RDI->fordblks = sVar3;
    in_RDI->keepcost = sVar2;
  }
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return in_RDI;
}

Assistant:

struct mallinfo dlmallinfo(void) {
  return internal_mallinfo(gm);
}